

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_copyCDictTableIntoCCtx
               (U32 *dst,U32 *src,size_t tableSize,ZSTD_compressionParameters *cParams)

{
  int iVar1;
  ZSTD_compressionParameters *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  void *in_RDI;
  U32 index;
  U32 taggedIndex;
  size_t i;
  undefined8 local_28;
  
  iVar1 = ZSTD_CDictIndicesAreTagged(in_RCX);
  if (iVar1 == 0) {
    memcpy(in_RDI,in_RSI,in_RDX << 2);
  }
  else {
    for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
      *(uint *)((long)in_RDI + local_28 * 4) = *(uint *)((long)in_RSI + local_28 * 4) >> 8;
    }
  }
  return;
}

Assistant:

static void ZSTD_copyCDictTableIntoCCtx(U32* dst, U32 const* src, size_t tableSize,
                                        ZSTD_compressionParameters const* cParams) {
    if (ZSTD_CDictIndicesAreTagged(cParams)){
        /* Remove tags from the CDict table if they are present.
         * See docs on "short cache" in zstd_compress_internal.h for context. */
        size_t i;
        for (i = 0; i < tableSize; i++) {
            U32 const taggedIndex = src[i];
            U32 const index = taggedIndex >> ZSTD_SHORT_CACHE_TAG_BITS;
            dst[i] = index;
        }
    } else {
        ZSTD_memcpy(dst, src, tableSize * sizeof(U32));
    }
}